

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

Parse * verona::parser(void)

{
  _Rb_tree_header *p_Var1;
  map<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>_>_>
  *this;
  iterator __position;
  source_location sVar2;
  DebugLocation DVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  RE2 *pRVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined8 uVar7;
  __impl *p_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type *this_01;
  long lVar9;
  Parse *in_RDI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  uint *puVar10;
  RuleDef *this_02;
  initializer_list<std::shared_ptr<trieste::detail::RuleDef>_> r;
  initializer_list<std::shared_ptr<trieste::detail::RuleDef>_> r_00;
  initializer_list<std::shared_ptr<trieste::detail::RuleDef>_> r_01;
  shared_ptr<re2::RE2> re_dir;
  undefined1 local_d59;
  uint *local_d58;
  source_location local_d50;
  Located<const_char_*> local_d48;
  source_location local_d38;
  Located<const_char_*> local_d30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d18;
  Parse *local_d10;
  Located<const_char_*> local_d08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_cf8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_cf0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_ce8;
  string local_ce0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_cc0;
  RE2 *local_cb8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_cb0;
  _Any_data local_ca8;
  code *local_c98;
  code *pcStack_c90;
  _Any_data local_c88;
  code *local_c78;
  code *pcStack_c70;
  _Any_data local_c68;
  code *local_c58;
  code *pcStack_c50;
  _Any_data local_c48;
  code *local_c38;
  code *pcStack_c30;
  _Any_data local_c28;
  code *local_c18;
  code *pcStack_c10;
  _Any_data local_c08;
  code *local_bf8;
  code *pcStack_bf0;
  _Any_data local_be8;
  code *local_bd8;
  code *pcStack_bd0;
  _Any_data local_bc8;
  code *local_bb8;
  code *pcStack_bb0;
  _Any_data local_ba8;
  code *local_b98;
  code *pcStack_b90;
  _Any_data local_b88;
  code *local_b78;
  code *pcStack_b70;
  _Any_data local_b68;
  code *local_b58;
  code *pcStack_b50;
  _Any_data local_b48;
  code *local_b38;
  code *pcStack_b30;
  _Any_data local_b28;
  code *local_b18;
  code *pcStack_b10;
  _Any_data local_b08;
  code *local_af8;
  code *pcStack_af0;
  _Any_data local_ae8;
  code *local_ad8;
  code *pcStack_ad0;
  _Any_data local_ac8;
  code *local_ab8;
  code *pcStack_ab0;
  _Any_data local_aa8;
  code *local_a98;
  code *pcStack_a90;
  _Any_data local_a88;
  code *local_a78;
  code *pcStack_a70;
  _Any_data local_a68;
  code *local_a58;
  code *pcStack_a50;
  _Any_data local_a48;
  code *local_a38;
  _Invoker_type p_Stack_a30;
  undefined1 local_a28 [8];
  undefined1 local_a20 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a10;
  RuleDef *local_a08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a00;
  undefined1 local_9f8 [16];
  RuleDef *local_9e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9e0;
  RuleDef *local_9d8;
  undefined1 local_9d0 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9c0;
  RuleDef *local_9b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9b0;
  undefined1 local_9a8 [16];
  RuleDef *local_998;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_990;
  RuleDef *local_988;
  undefined1 local_980 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_970;
  RuleDef *local_968;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_960;
  undefined1 local_958 [16];
  RuleDef *local_948;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_940;
  RuleDef *local_938;
  undefined1 local_930 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_920;
  RuleDef *local_918;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_910;
  undefined1 local_908 [16];
  RuleDef *local_8f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8f0;
  RuleDef *local_8e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8e0;
  RuleDef *local_8d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8d0;
  RuleDef *local_8c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8c0;
  RuleDef *local_8b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8b0;
  RuleDef *local_8a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8a0;
  RuleDef *local_898;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_890;
  RuleDef *local_888;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_880;
  RuleDef *local_878;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_870;
  RuleDef *local_868;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_860;
  RuleDef *local_858;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_850;
  RuleDef *local_848;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_840;
  RuleDef *local_838;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_830;
  RuleDef *local_828;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_820;
  RuleDef *local_818;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_810;
  RuleDef *local_808;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_800;
  RuleDef *local_7f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7f0;
  RuleDef *local_7e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7e0;
  RuleDef *local_7d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7d0;
  RuleDef *local_7c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7c0;
  RuleDef *local_7b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7b0;
  RuleDef *local_7a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7a0;
  RuleDef *local_798;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_790;
  RuleDef *local_788;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_780;
  RuleDef *local_778;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_770;
  RuleDef *local_768;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_760;
  RuleDef *local_758;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_750;
  RuleDef *local_748;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_740;
  RuleDef *local_738;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_730;
  RuleDef *local_728;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_720;
  RuleDef *local_718;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_710;
  RuleDef *local_708;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_700;
  RuleDef *local_6f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6f0;
  RuleDef *local_6e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6e0;
  _Any_data local_6d8;
  code *local_6c8;
  code *local_6c0;
  _Any_data local_6b8;
  code *local_6a8;
  code *local_6a0;
  _Any_data local_698;
  code *local_688;
  code *local_680;
  _Any_data local_678;
  code *local_668;
  code *local_660;
  _Any_data local_658;
  code *local_648;
  code *local_640;
  _Any_data local_638;
  code *local_628;
  code *local_620;
  _Any_data local_618;
  code *local_608;
  code *local_600;
  _Any_data local_5f8;
  code *local_5e8;
  code *local_5e0;
  _Any_data local_5d8;
  code *local_5c8;
  code *local_5c0;
  _Any_data local_5b8;
  code *local_5a8;
  code *local_5a0;
  _Any_data local_598;
  code *local_588;
  code *local_580;
  _Any_data local_578;
  code *local_568;
  code *local_560;
  _Any_data local_558;
  code *local_548;
  code *local_540;
  _Any_data local_538;
  code *local_528;
  code *local_520;
  _Any_data local_518;
  code *local_508;
  code *local_500;
  _Any_data local_4f8;
  code *local_4e8;
  code *local_4e0;
  _Any_data local_4d8;
  code *local_4c8;
  code *local_4c0;
  _Any_data local_4b8;
  code *local_4a8;
  code *local_4a0;
  _Any_data local_498;
  code *local_488;
  code *local_480;
  _Any_data local_478;
  code *local_468;
  code *local_460;
  _Any_data local_458;
  code *local_448;
  code *local_440;
  _Any_data local_438;
  code *local_428;
  code *local_420;
  _Any_data local_418;
  code *local_408;
  code *local_400;
  _Any_data local_3f8;
  code *local_3e8;
  code *local_3e0;
  _Any_data local_3d8;
  code *local_3c8;
  code *local_3c0;
  _Any_data local_3b8;
  code *local_3a8;
  code *local_3a0;
  _Any_data local_398;
  code *local_388;
  code *local_380;
  _Any_data local_378;
  code *local_368;
  code *local_360;
  _Any_data local_358;
  code *local_348;
  code *local_340;
  _Any_data local_338;
  code *local_328;
  code *local_320;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  _Any_data local_2f8;
  code *local_2e8;
  code *local_2e0;
  _Any_data local_2d8;
  code *local_2c8;
  code *local_2c0;
  _Any_data local_2b8;
  code *local_2a8;
  code *local_2a0;
  _Any_data local_298;
  code *local_288;
  code *local_280;
  _Any_data local_278;
  code *local_268;
  code *local_260;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  _Any_data local_238;
  code *local_228;
  code *local_220;
  _Any_data local_218;
  code *local_208;
  code *local_200;
  _Any_data local_1f8;
  code *local_1e8;
  code *local_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *local_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  _Any_data local_198;
  code *local_188;
  code *local_180;
  _Any_data local_178;
  code *local_168;
  code *local_160;
  _Any_data local_158;
  code *local_148;
  code *local_140;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  in_RDI->depth_ = subdirectories;
  in_RDI->wf_ = (Wellformed *)wfParser;
  CLI::std::filesystem::__cxx11::path::path(&in_RDI->exe);
  p_Var1 = &(in_RDI->rules)._M_t._M_impl.super__Rb_tree_header;
  (in_RDI->rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&in_RDI->prefile_,0,0xc0);
  (in_RDI->rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->rules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(in_RDI->gens)._M_t._M_impl.super__Rb_tree_header;
  (in_RDI->gens)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->gens)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->gens)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->gens)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->gens)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_cb8 = (RE2 *)0x0;
  local_d10 = in_RDI;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<re2::RE2,std::allocator<re2::RE2>,char_const(&)[27]>
            (&local_cb0,&local_cb8,(allocator<re2::RE2> *)local_a28,
             (char (*) [27])"[_[:alpha:]][_[:alnum:]]*?");
  p_Var8 = (__impl *)operator_new(0x18);
  p_Var8->_M_function_name = (char *)0x100000001;
  p_Var8->_M_file_name = (char *)&PTR___Sp_counted_ptr_inplace_002d3a10;
  p_Var8->_M_line = 0;
  p_Var8->_M_column = 0;
  local_d38._M_impl = p_Var8;
  local_d50._M_impl = (__impl *)operator_new(0x20);
  (local_d50._M_impl)->_M_function_name = (char *)0x100000001;
  (local_d50._M_impl)->_M_file_name = (char *)&PTR___Sp_counted_ptr_inplace_002d3490;
  (local_d50._M_impl)->_M_line = 0;
  (local_d50._M_impl)->_M_column = 0;
  local_d50._M_impl[1]._M_file_name = (char *)0x0;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002d3a60;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 0;
  this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_ce8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  this_02 = (RuleDef *)(this_00 + 1);
  local_ce8->_M_use_count = 1;
  local_ce8->_M_weak_count = 1;
  local_ce8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002d3ab0;
  local_ce8[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_ce8[1]._M_use_count = 0;
  local_ce8[1]._M_weak_count = 0;
  local_ce8[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_ce8[2]._M_use_count = 0;
  local_ce8[2]._M_weak_count = 0;
  __position._M_current = *(unsigned_long **)&this_00[1]._M_use_count;
  if ((_func_int **)__position._M_current == this_00[2]._vptr__Sp_counted_base) {
    ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_02,__position,&restart);
  }
  else {
    *__position._M_current = 0;
    *(unsigned_long **)&this_00[1]._M_use_count = __position._M_current + 1;
  }
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = ::std::
             _Function_handler<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:55:15)>
             ::_M_invoke;
  local_48 = ::std::
             _Function_handler<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:55:15)>
             ::_M_manager;
  ::std::function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)>::operator=
            ((function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)> *)
             &in_RDI->prefile_,
             (function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)> *)
             &local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  _Var6._M_pi = local_cb0._M_pi;
  pRVar5 = local_cb8;
  if (local_cb0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_cb0._M_pi)->_M_use_count = (local_cb0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_cb0._M_pi)->_M_use_count = (local_cb0._M_pi)->_M_use_count + 1;
    }
  }
  local_a38 = (code *)0x0;
  p_Stack_a30 = (_Invoker_type)0x0;
  local_a48._M_unused._M_object = (void *)0x0;
  local_a48._8_8_ = 0;
  local_a48._M_unused._M_object = operator_new(0x10);
  *(RE2 **)local_a48._M_unused._0_8_ = pRVar5;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_a48._M_unused._0_8_ + 8) =
       _Var6._M_pi;
  p_Stack_a30 = ::std::
                _Function_handler<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:57:14)>
                ::_M_invoke;
  local_a38 = ::std::
              _Function_handler<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:57:14)>
              ::_M_manager;
  ::std::function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)>::operator=
            ((function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)> *)
             &local_d10->predir_,
             (function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)> *)
             &local_a48);
  sVar2._M_impl = local_d38._M_impl;
  if (local_a38 != (code *)0x0) {
    (*local_a38)(&local_a48,&local_a48,__destroy_functor);
  }
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = ::std::
             _Function_handler<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:61:17)>
             ::_M_invoke;
  local_68 = ::std::
             _Function_handler<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:61:17)>
             ::_M_manager;
  ::std::
  function<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>)>
  ::operator=(&local_d10->postparse_,
              (function<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>)>
               *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_a10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2._M_impl;
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&(sVar2._M_impl)->_M_function_name = *(int *)&(sVar2._M_impl)->_M_function_name + 1;
    UNLOCK();
  }
  else {
    *(int *)&(sVar2._M_impl)->_M_function_name = *(int *)&(sVar2._M_impl)->_M_function_name + 1;
  }
  local_a58 = (code *)0x0;
  pcStack_a50 = (code *)0x0;
  local_a68._M_unused._M_object = (void *)0x0;
  local_a68._8_8_ = 0;
  local_a28 = (undefined1  [8])this_02;
  local_a20._0_8_ = this_00;
  local_a20._8_8_ = &p_Var8->_M_line;
  local_a68._M_unused._M_object = operator_new(0x20);
  _Var6._M_pi = local_a10._M_pi;
  uVar7 = local_a20._0_8_;
  *(undefined1 (*) [8])local_a68._M_unused._0_8_ = local_a28;
  *(undefined8 *)((long)local_a68._M_unused._0_8_ + 8) = 0;
  local_a20._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)((long)local_a68._M_unused._0_8_ + 8) = uVar7;
  local_a28 = (undefined1  [8])0x0;
  *(undefined8 *)((long)local_a68._M_unused._0_8_ + 0x10) = local_a20._8_8_;
  *(undefined8 *)((long)local_a68._M_unused._0_8_ + 0x18) = 0;
  local_a10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_a68._M_unused._0_8_ + 0x18) =
       _Var6._M_pi;
  local_a20._8_8_ = 0;
  pcStack_a50 = ::std::
                _Function_handler<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:70:16)>
                ::_M_invoke;
  local_a58 = ::std::
              _Function_handler<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:70:16)>
              ::_M_manager;
  ::std::
  function<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>)>
  ::operator=(&local_d10->postfile_,
              (function<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>)>
               *)&local_a68);
  if (local_a58 != (code *)0x0) {
    (*local_a58)((_Any_data *)&local_a68,(_Any_data *)&local_a68,__destroy_functor);
  }
  local_ce0._M_dataplus._M_p = (pointer)&local_ce0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_ce0,"start","");
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_a78 = (code *)0x0;
  pcStack_a70 = (code *)0x0;
  local_a88._M_unused._M_object = (void *)0x0;
  local_a88._8_8_ = 0;
  local_a88._M_unused._M_object = operator_new(0x10);
  *(RuleDef **)local_a88._M_unused._0_8_ = this_02;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_a88._M_unused._0_8_ + 8) = this_00;
  pcStack_a70 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:80:11)>
                ::_M_invoke;
  local_a78 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:80:11)>
              ::_M_manager;
  local_d08.value = "\r?\n(?:[[:blank:]]*\r?\n)+([[:blank:]]*)";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d2ee0;
  local_a28 = (undefined1  [8])0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a20,(RuleDef **)local_a28,
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_a88);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_a98 = (code *)0x0;
  pcStack_a90 = (code *)0x0;
  local_aa8._M_unused._M_object = (void *)0x0;
  local_aa8._8_8_ = 0;
  local_aa8._M_unused._M_object = operator_new(0x10);
  *(RuleDef **)local_aa8._M_unused._0_8_ = this_02;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_aa8._M_unused._0_8_ + 8) = this_00;
  pcStack_a90 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:87:11)>
                ::_M_invoke;
  local_a98 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:87:11)>
              ::_M_manager;
  local_d08.value = "\r?\n([[:blank:]]*(\\{)[[:blank:]]*)";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d2ef8;
  local_a20._8_8_ = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_a10,(RuleDef **)(local_a20 + 8),
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_aa8);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_ab8 = (code *)0x0;
  pcStack_ab0 = (code *)0x0;
  local_ac8._M_unused._M_object = (void *)0x0;
  local_ac8._8_8_ = 0;
  local_ac8._M_unused._M_object = operator_new(0x10);
  *(RuleDef **)local_ac8._M_unused._0_8_ = this_02;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_ac8._M_unused._0_8_ + 8) = this_00;
  pcStack_ab0 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:94:11)>
                ::_M_invoke;
  local_ab8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:94:11)>
              ::_M_manager;
  local_d08.value = "\r?\n([[:blank:]]*)";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d2f10;
  local_a08 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_a00,&local_a08,(allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_ac8);
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = ::std::
             _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:118:27)>
             ::_M_invoke;
  local_88 = ::std::
             _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:118:27)>
             ::_M_manager;
  local_d08.value = "[[:blank:]]+";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d2f28;
  local_9f8._0_8_ = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_9f8 + 8),(RuleDef **)local_9f8,
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_98);
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = ::std::
             _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:121:16)>
             ::_M_invoke;
  local_a8 = ::std::
             _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:121:16)>
             ::_M_manager;
  local_d08.value = ";";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d2f40;
  local_9e8 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_9e0,&local_9e8,(allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_b8);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_ad8 = (code *)0x0;
  pcStack_ad0 = (code *)0x0;
  local_ae8._M_unused._M_object = (void *)0x0;
  local_ae8._8_8_ = 0;
  local_ae8._M_unused._M_object = operator_new(0x10);
  *(RuleDef **)local_ae8._M_unused._0_8_ = this_02;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_ae8._M_unused._0_8_ + 8) = this_00;
  pcStack_ad0 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:125:11)>
                ::_M_invoke;
  local_ad8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:125:11)>
              ::_M_manager;
  local_d08.value = "=>";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d2f58;
  local_9d8 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_9d0,&local_9d8,
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_ae8);
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = ::std::
             _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:133:16)>
             ::_M_invoke;
  local_c8 = ::std::
             _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:133:16)>
             ::_M_manager;
  local_d08.value = ",";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d2f70;
  local_9d0._8_8_ = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_9c0,(RuleDef **)(local_9d0 + 8),
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_d8);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_af8 = (code *)0x0;
  pcStack_af0 = (code *)0x0;
  local_b08._M_unused._M_object = (void *)0x0;
  local_b08._8_8_ = 0;
  local_b08._M_unused._M_object = operator_new(0x10);
  *(RuleDef **)local_b08._M_unused._0_8_ = this_02;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_b08._M_unused._0_8_ + 8) = this_00;
  pcStack_af0 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:137:11)>
                ::_M_invoke;
  local_af8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:137:11)>
              ::_M_manager;
  local_d08.value = "(\\()[[:blank:]]*";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d2f88;
  local_9b8 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_9b0,&local_9b8,(allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_b08);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_b18 = (code *)0x0;
  pcStack_b10 = (code *)0x0;
  local_b28._M_unused._M_object = (void *)0x0;
  local_b28._8_8_ = 0;
  local_b28._M_unused._M_object = operator_new(0x10);
  *(RuleDef **)local_b28._M_unused._0_8_ = this_02;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_b28._M_unused._0_8_ + 8) = this_00;
  pcStack_b10 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:143:11)>
                ::_M_invoke;
  local_b18 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:143:11)>
              ::_M_manager;
  local_d08.value = "\\)";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d2fa0;
  local_9a8._0_8_ = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_9a8 + 8),(RuleDef **)local_9a8,
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_b28);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_b38 = (code *)0x0;
  pcStack_b30 = (code *)0x0;
  local_b48._M_unused._M_object = (void *)0x0;
  local_b48._8_8_ = 0;
  local_b48._M_unused._M_object = operator_new(0x10);
  *(RuleDef **)local_b48._M_unused._0_8_ = this_02;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_b48._M_unused._0_8_ + 8) = this_00;
  pcStack_b30 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:151:11)>
                ::_M_invoke;
  local_b38 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:151:11)>
              ::_M_manager;
  local_d08.value = "(\\[)[[:blank:]]*";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d2fb8;
  local_998 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_990,&local_998,(allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_b48);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_b58 = (code *)0x0;
  pcStack_b50 = (code *)0x0;
  local_b68._M_unused._M_object = (void *)0x0;
  local_b68._8_8_ = 0;
  local_b68._M_unused._M_object = operator_new(0x10);
  *(RuleDef **)local_b68._M_unused._0_8_ = this_02;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_b68._M_unused._0_8_ + 8) = this_00;
  pcStack_b50 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:157:11)>
                ::_M_invoke;
  local_b58 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:157:11)>
              ::_M_manager;
  local_d08.value = "\\]";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d2fd0;
  local_988 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_980,&local_988,
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_b68);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_b78 = (code *)0x0;
  pcStack_b70 = (code *)0x0;
  local_b88._M_unused._M_object = (void *)0x0;
  local_b88._8_8_ = 0;
  local_b88._M_unused._M_object = operator_new(0x10);
  *(RuleDef **)local_b88._M_unused._0_8_ = this_02;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_b88._M_unused._0_8_ + 8) = this_00;
  pcStack_b70 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:165:11)>
                ::_M_invoke;
  local_b78 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:165:11)>
              ::_M_manager;
  local_d08.value = "(\\{)[[:blank:]]*";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d2fe8;
  local_980._8_8_ = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_970,(RuleDef **)(local_980 + 8),
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_b88);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_b98 = (code *)0x0;
  pcStack_b90 = (code *)0x0;
  local_ba8._M_unused._M_object = (void *)0x0;
  local_ba8._8_8_ = 0;
  local_ba8._M_unused._M_object = operator_new(0x10);
  *(RuleDef **)local_ba8._M_unused._0_8_ = this_02;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_ba8._M_unused._0_8_ + 8) = this_00;
  pcStack_b90 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:171:11)>
                ::_M_invoke;
  local_b98 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:171:11)>
              ::_M_manager;
  local_d08.value = "\\}";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3000;
  local_968 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_960,&local_968,(allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_ba8);
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = ::std::
             _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:178:22)>
             ::_M_invoke;
  local_e8 = ::std::
             _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:178:22)>
             ::_M_manager;
  local_d08.value = "true\\b";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3018;
  local_958._0_8_ = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_958 + 8),(RuleDef **)local_958,
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_f8);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:179:23)>
              ::_M_invoke;
  local_108 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:179:23)>
              ::_M_manager;
  local_d08.value = "false\\b";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3030;
  local_948 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_940,&local_948,(allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_118);
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:183:11)>
              ::_M_invoke;
  local_128 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:183:11)>
              ::_M_manager;
  local_d08.value = "0x[_[:xdigit:]]+\\.[_[:xdigit:]]+(?:p[+-][_[:digit:]]+)?\\b";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3048;
  local_938 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_930,&local_938,
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_138);
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:187:11)>
              ::_M_invoke;
  local_148 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:187:11)>
              ::_M_manager;
  local_d08.value = "[[:digit:]][_[:digit:]]*\\.[_[:digit:]]+(?:e[+-]?[_[:digit:]]+)?\\b";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3060;
  local_930._8_8_ = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_920,(RuleDef **)(local_930 + 8),
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_158);
  local_178._M_unused._M_object = (void *)0x0;
  local_178._8_8_ = 0;
  local_160 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:190:26)>
              ::_M_invoke;
  local_168 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:190:26)>
              ::_M_manager;
  local_d08.value = "0b[_01]+\\b";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3078;
  local_918 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_910,&local_918,(allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_178);
  local_198._M_unused._M_object = (void *)0x0;
  local_198._8_8_ = 0;
  local_180 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:193:32)>
              ::_M_invoke;
  local_188 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:193:32)>
              ::_M_manager;
  local_d08.value = "0o[_01234567]+\\b";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3090;
  local_908._0_8_ = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_908 + 8),(RuleDef **)local_908,
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_198);
  local_1b8._M_unused._M_object = (void *)0x0;
  local_1b8._8_8_ = 0;
  local_1a0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:196:34)>
              ::_M_invoke;
  local_1a8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:196:34)>
              ::_M_manager;
  local_d08.value = "0x[_[:xdigit:]]+\\b";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d30a8;
  local_8f8 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_8f0,&local_8f8,(allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_1b8);
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  local_1c0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:199:42)>
              ::_M_invoke;
  local_1c8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:199:42)>
              ::_M_manager;
  local_d08.value = "[[:digit:]][_[:digit:]]*\\b";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d30c0;
  local_8e8 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_8e0,&local_8e8,(allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_1d8);
  local_1f8._M_unused._M_object = (void *)0x0;
  local_1f8._8_8_ = 0;
  local_1e0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:202:37)>
              ::_M_invoke;
  local_1e8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:202:37)>
              ::_M_manager;
  local_d08.value = "\"((?:\\\"|[^\"])*?)\"";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d30d8;
  local_8d8 = (RuleDef *)0x0;
  local_d58 = &p_Var8->_M_line;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_8d0,&local_8d8,(allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_1f8);
  puVar10 = &(local_d50._M_impl)->_M_line;
  local_cf8 = local_ce8 + 1;
  local_d08.location.location._M_impl = (source_location)(source_location)local_d50._M_impl;
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&(local_d50._M_impl)->_M_function_name =
         *(int *)&(local_d50._M_impl)->_M_function_name + 1;
    UNLOCK();
  }
  else {
    *(int *)&(local_d50._M_impl)->_M_function_name =
         *(int *)&(local_d50._M_impl)->_M_function_name + 1;
  }
  local_cf0 = local_ce8;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_ce8->_M_use_count = local_ce8->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_ce8->_M_use_count = local_ce8->_M_use_count + 1;
  }
  local_bb8 = (code *)0x0;
  pcStack_bb0 = (code *)0x0;
  local_bc8._M_unused._M_object = (void *)0x0;
  local_bc8._8_8_ = 0;
  local_d08.value = (char *)puVar10;
  local_cc0 = local_cf8;
  local_bc8._M_unused._M_object = operator_new(0x20);
  p_Var4 = local_cf0;
  DVar3.location._M_impl = (source_location)(source_location)local_d08.location;
  *(char **)local_bc8._M_unused._0_8_ = local_d08.value;
  *(long *)((long)local_bc8._M_unused._0_8_ + 8) = 0;
  local_d08.location.location._M_impl = (source_location)(__impl *)0x0;
  *(source_location *)((long)local_bc8._M_unused._0_8_ + 8) = DVar3.location._M_impl;
  local_d08.value = (char *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_bc8._M_unused._0_8_ + 0x10) =
       local_cf8;
  *(long *)((long)local_bc8._M_unused._0_8_ + 0x18) = 0;
  local_cf0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_bc8._M_unused._0_8_ + 0x18) =
       p_Var4;
  local_cf8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pcStack_bb0 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:206:11)>
                ::_M_invoke;
  local_bb8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:206:11)>
              ::_M_manager;
  local_d30.value = "([\']+)\"([^\"]*)";
  local_d30.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d30f0;
  local_8c8 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_8c0,&local_8c8,(allocator<trieste::detail::RuleDef> *)&local_d48,&local_d30,
             (function<void_(trieste::detail::Make_&)> *)&local_bc8);
  local_218._M_unused._M_object = (void *)0x0;
  local_218._8_8_ = 0;
  local_200 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:215:32)>
              ::_M_invoke;
  local_208 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:215:32)>
              ::_M_manager;
  local_d30.value = "\'((?:\\\'|[^\'])*)\'";
  local_d30.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3108;
  local_8b8 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_8b0,&local_8b8,(allocator<trieste::detail::RuleDef> *)&local_d48,&local_d30,
             (function<void_(trieste::detail::Make_&)> *)&local_218);
  local_238._M_unused._M_object = (void *)0x0;
  local_238._8_8_ = 0;
  local_220 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:218:44)>
              ::_M_invoke;
  local_228 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:218:44)>
              ::_M_manager;
  local_d30.value = ":\\[((?:[^\\]]|\\][^:])*)\\]:";
  local_d30.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3120;
  local_8a8 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_8a0,&local_8a8,(allocator<trieste::detail::RuleDef> *)&local_d48,&local_d30,
             (function<void_(trieste::detail::Make_&)> *)&local_238);
  local_258._M_unused._M_object = (void *)0x0;
  local_258._8_8_ = 0;
  local_240 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:221:25)>
              ::_M_invoke;
  local_248 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:221:25)>
              ::_M_manager;
  local_d30.value = "//[^\r\n]*";
  local_d30.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3138;
  local_898 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_890,&local_898,(allocator<trieste::detail::RuleDef> *)&local_d48,&local_d30,
             (function<void_(trieste::detail::Make_&)> *)&local_258);
  local_d30.value = (char *)local_d58;
  local_d30.location.location._M_impl = (source_location)(source_location)local_d38._M_impl;
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&(local_d38._M_impl)->_M_function_name =
         *(int *)&(local_d38._M_impl)->_M_function_name + 1;
    UNLOCK();
  }
  else {
    *(int *)&(local_d38._M_impl)->_M_function_name =
         *(int *)&(local_d38._M_impl)->_M_function_name + 1;
  }
  local_d20 = local_cc0;
  local_d18 = local_ce8;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_ce8->_M_use_count = local_ce8->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_ce8->_M_use_count = local_ce8->_M_use_count + 1;
  }
  local_bd8 = (code *)0x0;
  pcStack_bd0 = (code *)0x0;
  local_be8._M_unused._M_object = (void *)0x0;
  local_be8._8_8_ = 0;
  local_be8._M_unused._M_object = operator_new(0x20);
  p_Var4 = local_d18;
  DVar3.location._M_impl = (source_location)(source_location)local_d30.location;
  *(char **)local_be8._M_unused._0_8_ = local_d30.value;
  *(long *)((long)local_be8._M_unused._0_8_ + 8) = 0;
  local_d30.location.location._M_impl = (source_location)(__impl *)0x0;
  *(source_location *)((long)local_be8._M_unused._0_8_ + 8) = DVar3.location._M_impl;
  local_d30.value = (char *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_be8._M_unused._0_8_ + 0x10) =
       local_d20;
  *(long *)((long)local_be8._M_unused._0_8_ + 0x18) = 0;
  local_d18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_be8._M_unused._0_8_ + 0x18) =
       p_Var4;
  local_d20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pcStack_bd0 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:225:11)>
                ::_M_invoke;
  local_bd8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:225:11)>
              ::_M_manager;
  local_d48.value = "/\\*";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3150;
  local_888 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_880,&local_888,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_be8);
  local_278._M_unused._M_object = (void *)0x0;
  local_278._8_8_ = 0;
  local_260 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:234:11)>
              ::_M_invoke;
  local_268 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:234:11)>
              ::_M_manager;
  local_d48.value = "use\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3168;
  local_878 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_870,&local_878,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_278);
  local_298._M_unused._M_object = (void *)0x0;
  local_298._8_8_ = 0;
  local_280 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:240:11)>
              ::_M_invoke;
  local_288 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:240:11)>
              ::_M_manager;
  local_d48.value = "type\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3180;
  local_868 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_860,&local_868,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_298);
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2a0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:246:11)>
              ::_M_invoke;
  local_2a8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:246:11)>
              ::_M_manager;
  local_d48.value = "class\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3198;
  local_858 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_850,&local_858,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_2b8);
  local_2d8._M_unused._M_object = (void *)0x0;
  local_2d8._8_8_ = 0;
  local_2c0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:251:23)>
              ::_M_invoke;
  local_2c8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:251:23)>
              ::_M_manager;
  local_d48.value = "where\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d31b0;
  local_848 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_840,&local_848,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_2d8);
  local_2f8._M_unused._M_object = (void *)0x0;
  local_2f8._8_8_ = 0;
  local_2e0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:252:21)>
              ::_M_invoke;
  local_2e8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:252:21)>
              ::_M_manager;
  local_d48.value = "var\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d31c8;
  local_838 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_830,&local_838,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_2f8);
  local_318._M_unused._M_object = (void *)0x0;
  local_318._8_8_ = 0;
  local_300 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:253:21)>
              ::_M_invoke;
  local_308 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:253:21)>
              ::_M_manager;
  local_d48.value = "let\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d31e0;
  local_828 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_820,&local_828,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_318);
  local_338._M_unused._M_object = (void *)0x0;
  local_338._8_8_ = 0;
  local_320 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:254:21)>
              ::_M_invoke;
  local_328 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:254:21)>
              ::_M_manager;
  local_d48.value = "ref\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d31f8;
  local_818 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_810,&local_818,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_338);
  local_358._M_unused._M_object = (void *)0x0;
  local_358._8_8_ = 0;
  local_340 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:255:22)>
              ::_M_invoke;
  local_348 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:255:22)>
              ::_M_manager;
  local_d48.value = "Self\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3210;
  local_808 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_800,&local_808,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_358);
  local_378._M_unused._M_object = (void *)0x0;
  local_378._8_8_ = 0;
  local_360 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:256:20)>
              ::_M_invoke;
  local_368 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:256:20)>
              ::_M_manager;
  local_d48.value = "if\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3228;
  local_7f8 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_7f0,&local_7f8,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_378);
  local_398._M_unused._M_object = (void *)0x0;
  local_398._8_8_ = 0;
  local_380 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:257:22)>
              ::_M_invoke;
  local_388 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:257:22)>
              ::_M_manager;
  local_d48.value = "else\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3240;
  local_7e8 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_7e0,&local_7e8,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_398);
  local_3b8._M_unused._M_object = (void *)0x0;
  local_3b8._8_8_ = 0;
  local_3a0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:258:21)>
              ::_M_invoke;
  local_3a8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:258:21)>
              ::_M_manager;
  local_d48.value = "new\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3258;
  local_7d8 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_7d0,&local_7d8,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_3b8);
  local_3d8._M_unused._M_object = (void *)0x0;
  local_3d8._8_8_ = 0;
  local_3c0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:259:21)>
              ::_M_invoke;
  local_3c8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:259:21)>
              ::_M_manager;
  local_d48.value = "try\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3270;
  local_7c8 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_7c0,&local_7c8,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_3d8);
  local_3f8._M_unused._M_object = (void *)0x0;
  local_3f8._8_8_ = 0;
  local_3e0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:260:21)>
              ::_M_invoke;
  local_3e8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:260:21)>
              ::_M_manager;
  local_d48.value = "iso\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3288;
  local_7b8 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_7b0,&local_7b8,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_3f8);
  local_418._M_unused._M_object = (void *)0x0;
  local_418._8_8_ = 0;
  local_400 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:261:21)>
              ::_M_invoke;
  local_408 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:261:21)>
              ::_M_manager;
  local_d48.value = "mut\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d32a0;
  local_7a8 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_7a0,&local_7a8,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_418);
  local_438._M_unused._M_object = (void *)0x0;
  local_438._8_8_ = 0;
  local_420 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:262:21)>
              ::_M_invoke;
  local_428 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:262:21)>
              ::_M_manager;
  local_d48.value = "imm\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d32b8;
  local_798 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_790,&local_798,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_438);
  local_458._M_unused._M_object = (void *)0x0;
  local_458._8_8_ = 0;
  local_440 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:265:19)>
              ::_M_invoke;
  local_448 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:265:19)>
              ::_M_manager;
  local_d48.value = "_\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d32d0;
  local_788 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_780,&local_788,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_458);
  local_478._M_unused._M_object = (void *)0x0;
  local_478._8_8_ = 0;
  local_460 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:269:11)>
              ::_M_invoke;
  local_468 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:269:11)>
              ::_M_manager;
  local_d48.value = "_(?:_)+\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d32e8;
  local_778 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_770,&local_778,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_478);
  local_498._M_unused._M_object = (void *)0x0;
  local_498._8_8_ = 0;
  local_480 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:275:43)>
              ::_M_invoke;
  local_488 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:275:43)>
              ::_M_manager;
  local_d48.value = "[_[:alpha:]][_[:alnum:]]*\\b";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3300;
  local_768 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_760,&local_768,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_498);
  local_4b8._M_unused._M_object = (void *)0x0;
  local_4b8._8_8_ = 0;
  local_4a0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:278:24)>
              ::_M_invoke;
  local_4a8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:278:24)>
              ::_M_manager;
  local_d48.value = "\\.\\.\\.";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3318;
  local_758 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_750,&local_758,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_4b8);
  local_4d8._M_unused._M_object = (void *)0x0;
  local_4d8._8_8_ = 0;
  local_4c0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:281:18)>
              ::_M_invoke;
  local_4c8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:281:18)>
              ::_M_manager;
  local_d48.value = "\\.";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3330;
  local_748 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_740,&local_748,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_4d8);
  local_4f8._M_unused._M_object = (void *)0x0;
  local_4f8._8_8_ = 0;
  local_4e0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:284:18)>
              ::_M_invoke;
  local_4e8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:284:18)>
              ::_M_manager;
  local_d48.value = ":::";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3348;
  local_738 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_730,&local_738,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_4f8);
  local_518._M_unused._M_object = (void *)0x0;
  local_518._8_8_ = 0;
  local_500 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:287:17)>
              ::_M_invoke;
  local_508 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:287:17)>
              ::_M_manager;
  local_d48.value = "::";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3360;
  local_728 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_720,&local_728,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_518);
  local_538._M_unused._M_object = (void *)0x0;
  local_538._8_8_ = 0;
  local_520 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:290:16)>
              ::_M_invoke;
  local_528 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:290:16)>
              ::_M_manager;
  local_d48.value = ":";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3378;
  local_718 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_710,&local_718,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_538);
  local_558._M_unused._M_object = (void *)0x0;
  local_558._8_8_ = 0;
  local_540 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:293:39)>
              ::_M_invoke;
  local_548 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:293:39)>
              ::_M_manager;
  local_d48.value = "=[!#$%&*+-/<=>?@\\^`|~]+";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3390;
  local_708 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_700,&local_708,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_558);
  local_578._M_unused._M_object = (void *)0x0;
  local_578._8_8_ = 0;
  local_560 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:296:16)>
              ::_M_invoke;
  local_568 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:296:16)>
              ::_M_manager;
  local_d48.value = "=";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d33a8;
  local_6f8 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_6f0,&local_6f8,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_578);
  local_598._M_unused._M_object = (void *)0x0;
  local_598._8_8_ = 0;
  local_580 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:299:38)>
              ::_M_invoke;
  local_588 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:299:38)>
              ::_M_manager;
  local_d48.value = "[!#$%&*+-/<=>?@\\^`|~]+";
  local_d48.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d33c0;
  local_6e8 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_6e0,&local_6e8,(allocator<trieste::detail::RuleDef> *)&local_d59,&local_d48,
             (function<void_(trieste::detail::Make_&)> *)&local_598);
  r._M_len = 0x35;
  r._M_array = (iterator)local_a28;
  trieste::Parse::operator()(local_d10,&local_ce0,r);
  lVar9 = 0x350;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&p_Stack_a30 + lVar9) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&p_Stack_a30 + lVar9));
    }
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != 0);
  if (local_588 != (code *)0x0) {
    (*local_588)((_Any_data *)&local_598,(_Any_data *)&local_598,__destroy_functor);
  }
  if (local_568 != (code *)0x0) {
    (*local_568)((_Any_data *)&local_578,(_Any_data *)&local_578,__destroy_functor);
  }
  if (local_548 != (code *)0x0) {
    (*local_548)((_Any_data *)&local_558,(_Any_data *)&local_558,__destroy_functor);
  }
  if (local_528 != (code *)0x0) {
    (*local_528)((_Any_data *)&local_538,(_Any_data *)&local_538,__destroy_functor);
  }
  if (local_508 != (code *)0x0) {
    (*local_508)((_Any_data *)&local_518,(_Any_data *)&local_518,__destroy_functor);
  }
  if (local_4e8 != (code *)0x0) {
    (*local_4e8)((_Any_data *)&local_4f8,(_Any_data *)&local_4f8,__destroy_functor);
  }
  if (local_4c8 != (code *)0x0) {
    (*local_4c8)((_Any_data *)&local_4d8,(_Any_data *)&local_4d8,__destroy_functor);
  }
  if (local_4a8 != (code *)0x0) {
    (*local_4a8)((_Any_data *)&local_4b8,(_Any_data *)&local_4b8,__destroy_functor);
  }
  if (local_488 != (code *)0x0) {
    (*local_488)((_Any_data *)&local_498,(_Any_data *)&local_498,__destroy_functor);
  }
  if (local_468 != (code *)0x0) {
    (*local_468)((_Any_data *)&local_478,(_Any_data *)&local_478,__destroy_functor);
  }
  if (local_448 != (code *)0x0) {
    (*local_448)((_Any_data *)&local_458,(_Any_data *)&local_458,__destroy_functor);
  }
  if (local_428 != (code *)0x0) {
    (*local_428)((_Any_data *)&local_438,(_Any_data *)&local_438,__destroy_functor);
  }
  if (local_408 != (code *)0x0) {
    (*local_408)((_Any_data *)&local_418,(_Any_data *)&local_418,__destroy_functor);
  }
  if (local_3e8 != (code *)0x0) {
    (*local_3e8)((_Any_data *)&local_3f8,(_Any_data *)&local_3f8,__destroy_functor);
  }
  if (local_3c8 != (code *)0x0) {
    (*local_3c8)((_Any_data *)&local_3d8,(_Any_data *)&local_3d8,__destroy_functor);
  }
  if (local_3a8 != (code *)0x0) {
    (*local_3a8)((_Any_data *)&local_3b8,(_Any_data *)&local_3b8,__destroy_functor);
  }
  if (local_388 != (code *)0x0) {
    (*local_388)((_Any_data *)&local_398,(_Any_data *)&local_398,__destroy_functor);
  }
  if (local_368 != (code *)0x0) {
    (*local_368)((_Any_data *)&local_378,(_Any_data *)&local_378,__destroy_functor);
  }
  if (local_348 != (code *)0x0) {
    (*local_348)((_Any_data *)&local_358,(_Any_data *)&local_358,__destroy_functor);
  }
  if (local_328 != (code *)0x0) {
    (*local_328)((_Any_data *)&local_338,(_Any_data *)&local_338,__destroy_functor);
  }
  if (local_308 != (code *)0x0) {
    (*local_308)((_Any_data *)&local_318,(_Any_data *)&local_318,__destroy_functor);
  }
  if (local_2e8 != (code *)0x0) {
    (*local_2e8)((_Any_data *)&local_2f8,(_Any_data *)&local_2f8,__destroy_functor);
  }
  if (local_2c8 != (code *)0x0) {
    (*local_2c8)((_Any_data *)&local_2d8,(_Any_data *)&local_2d8,__destroy_functor);
  }
  if (local_2a8 != (code *)0x0) {
    (*local_2a8)((_Any_data *)&local_2b8,(_Any_data *)&local_2b8,__destroy_functor);
  }
  if (local_288 != (code *)0x0) {
    (*local_288)((_Any_data *)&local_298,(_Any_data *)&local_298,__destroy_functor);
  }
  if (local_268 != (code *)0x0) {
    (*local_268)((_Any_data *)&local_278,(_Any_data *)&local_278,__destroy_functor);
  }
  if (local_bd8 != (code *)0x0) {
    (*local_bd8)((_Any_data *)&local_be8,(_Any_data *)&local_be8,__destroy_functor);
  }
  if (local_d18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d18);
  }
  if (local_d30.location.location._M_impl != (__impl *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d30.location.location._M_impl);
  }
  if (local_248 != (code *)0x0) {
    (*local_248)((_Any_data *)&local_258,(_Any_data *)&local_258,__destroy_functor);
  }
  if (local_228 != (code *)0x0) {
    (*local_228)((_Any_data *)&local_238,(_Any_data *)&local_238,__destroy_functor);
  }
  if (local_208 != (code *)0x0) {
    (*local_208)((_Any_data *)&local_218,(_Any_data *)&local_218,__destroy_functor);
  }
  if (local_bb8 != (code *)0x0) {
    (*local_bb8)((_Any_data *)&local_bc8,(_Any_data *)&local_bc8,__destroy_functor);
  }
  if (local_cf0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_cf0);
  }
  if (local_d08.location.location._M_impl != (__impl *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d08.location.location._M_impl);
  }
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)((_Any_data *)&local_1f8,(_Any_data *)&local_1f8,__destroy_functor);
  }
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)((_Any_data *)&local_1d8,(_Any_data *)&local_1d8,__destroy_functor);
  }
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)((_Any_data *)&local_1b8,(_Any_data *)&local_1b8,__destroy_functor);
  }
  if (local_188 != (code *)0x0) {
    (*local_188)((_Any_data *)&local_198,(_Any_data *)&local_198,__destroy_functor);
  }
  if (local_168 != (code *)0x0) {
    (*local_168)((_Any_data *)&local_178,(_Any_data *)&local_178,__destroy_functor);
  }
  if (local_148 != (code *)0x0) {
    (*local_148)((_Any_data *)&local_158,(_Any_data *)&local_158,__destroy_functor);
  }
  if (local_128 != (code *)0x0) {
    (*local_128)((_Any_data *)&local_138,(_Any_data *)&local_138,__destroy_functor);
  }
  if (local_108 != (code *)0x0) {
    (*local_108)((_Any_data *)&local_118,(_Any_data *)&local_118,__destroy_functor);
  }
  if (local_e8 != (code *)0x0) {
    (*local_e8)((_Any_data *)&local_f8,(_Any_data *)&local_f8,__destroy_functor);
  }
  if (local_b98 != (code *)0x0) {
    (*local_b98)((_Any_data *)&local_ba8,(_Any_data *)&local_ba8,__destroy_functor);
  }
  if (local_b78 != (code *)0x0) {
    (*local_b78)((_Any_data *)&local_b88,(_Any_data *)&local_b88,__destroy_functor);
  }
  if (local_b58 != (code *)0x0) {
    (*local_b58)((_Any_data *)&local_b68,(_Any_data *)&local_b68,__destroy_functor);
  }
  if (local_b38 != (code *)0x0) {
    (*local_b38)((_Any_data *)&local_b48,(_Any_data *)&local_b48,__destroy_functor);
  }
  if (local_b18 != (code *)0x0) {
    (*local_b18)((_Any_data *)&local_b28,(_Any_data *)&local_b28,__destroy_functor);
  }
  if (local_af8 != (code *)0x0) {
    (*local_af8)((_Any_data *)&local_b08,(_Any_data *)&local_b08,__destroy_functor);
  }
  if (local_c8 != (code *)0x0) {
    (*local_c8)((_Any_data *)&local_d8,(_Any_data *)&local_d8,__destroy_functor);
  }
  if (local_ad8 != (code *)0x0) {
    (*local_ad8)((_Any_data *)&local_ae8,(_Any_data *)&local_ae8,__destroy_functor);
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)((_Any_data *)&local_b8,(_Any_data *)&local_b8,__destroy_functor);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)((_Any_data *)&local_98,(_Any_data *)&local_98,__destroy_functor);
  }
  if (local_ab8 != (code *)0x0) {
    (*local_ab8)((_Any_data *)&local_ac8,(_Any_data *)&local_ac8,__destroy_functor);
  }
  if (local_a98 != (code *)0x0) {
    (*local_a98)((_Any_data *)&local_aa8,(_Any_data *)&local_aa8,__destroy_functor);
  }
  if (local_a78 != (code *)0x0) {
    (*local_a78)((_Any_data *)&local_a88,(_Any_data *)&local_a88,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ce0._M_dataplus._M_p != &local_ce0.field_2) {
    operator_delete(local_ce0._M_dataplus._M_p,local_ce0.field_2._M_allocated_capacity + 1);
  }
  local_ce0._M_dataplus._M_p = (pointer)&local_ce0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_ce0,"string","");
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&(local_d50._M_impl)->_M_function_name =
         *(int *)&(local_d50._M_impl)->_M_function_name + 1;
    UNLOCK();
  }
  else {
    *(int *)&(local_d50._M_impl)->_M_function_name =
         *(int *)&(local_d50._M_impl)->_M_function_name + 1;
  }
  local_bf8 = (code *)0x0;
  pcStack_bf0 = (code *)0x0;
  local_c08._M_unused._M_object = (void *)0x0;
  local_c08._8_8_ = 0;
  local_c08._M_unused._M_object = operator_new(0x10);
  *(uint **)local_c08._M_unused._0_8_ = puVar10;
  *(__impl **)((long)local_c08._M_unused._0_8_ + 8) = local_d50._M_impl;
  pcStack_bf0 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:305:11)>
                ::_M_invoke;
  local_bf8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:305:11)>
              ::_M_manager;
  local_d08.value = "\"\'";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d33d8;
  local_a28 = (undefined1  [8])0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a20,(RuleDef **)local_a28,
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_c08);
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&(local_d50._M_impl)->_M_function_name =
         *(int *)&(local_d50._M_impl)->_M_function_name + 1;
    UNLOCK();
  }
  else {
    *(int *)&(local_d50._M_impl)->_M_function_name =
         *(int *)&(local_d50._M_impl)->_M_function_name + 1;
  }
  local_c18 = (code *)0x0;
  pcStack_c10 = (code *)0x0;
  local_c28._M_unused._M_object = (void *)0x0;
  local_c28._8_8_ = 0;
  local_c28._M_unused._M_object = operator_new(0x10);
  *(uint **)local_c28._M_unused._0_8_ = puVar10;
  *(__impl **)((long)local_c28._M_unused._0_8_ + 8) = local_d50._M_impl;
  pcStack_c10 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:313:11)>
                ::_M_invoke;
  local_c18 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:313:11)>
              ::_M_manager;
  local_d08.value = "\'";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d33f0;
  local_a20._8_8_ = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_a10,(RuleDef **)(local_a20 + 8),
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_c28);
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&(local_d50._M_impl)->_M_function_name =
         *(int *)&(local_d50._M_impl)->_M_function_name + 1;
    UNLOCK();
  }
  else {
    *(int *)&(local_d50._M_impl)->_M_function_name =
         *(int *)&(local_d50._M_impl)->_M_function_name + 1;
  }
  local_c38 = (code *)0x0;
  pcStack_c30 = (code *)0x0;
  local_c48._M_unused._M_object = (void *)0x0;
  local_c48._8_8_ = 0;
  local_c48._M_unused._M_object = operator_new(0x10);
  *(uint **)local_c48._M_unused._0_8_ = puVar10;
  *(__impl **)((long)local_c48._M_unused._0_8_ + 8) = local_d50._M_impl;
  pcStack_c30 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:322:16)>
                ::_M_invoke;
  local_c38 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:322:16)>
              ::_M_manager;
  local_d08.value = ".";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3408;
  local_a08 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_a00,&local_a08,(allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_c48);
  r_00._M_len = 3;
  r_00._M_array = (iterator)local_a28;
  trieste::Parse::operator()(local_d10,&local_ce0,r_00);
  puVar10 = local_d58;
  lVar9 = 0x30;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&p_Stack_a30 + lVar9) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&p_Stack_a30 + lVar9));
    }
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != 0);
  if (local_c38 != (code *)0x0) {
    (*local_c38)((_Any_data *)&local_c48,(_Any_data *)&local_c48,__destroy_functor);
  }
  if (local_c18 != (code *)0x0) {
    (*local_c18)((_Any_data *)&local_c28,(_Any_data *)&local_c28,__destroy_functor);
  }
  if (local_bf8 != (code *)0x0) {
    (*local_bf8)((_Any_data *)&local_c08,(_Any_data *)&local_c08,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ce0._M_dataplus._M_p != &local_ce0.field_2) {
    operator_delete(local_ce0._M_dataplus._M_p,local_ce0.field_2._M_allocated_capacity + 1);
  }
  local_ce0._M_dataplus._M_p = (pointer)&local_ce0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_ce0,"comment","");
  local_5b8._M_unused._M_object = (void *)0x0;
  local_5b8._8_8_ = 0;
  local_5a0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:327:23)>
              ::_M_invoke;
  local_5a8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:327:23)>
              ::_M_manager;
  local_d08.value = "[^/\\*]+";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3420;
  local_a28 = (undefined1  [8])0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a20,(RuleDef **)local_a28,
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_5b8);
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&(local_d38._M_impl)->_M_function_name =
         *(int *)&(local_d38._M_impl)->_M_function_name + 1;
    UNLOCK();
  }
  else {
    *(int *)&(local_d38._M_impl)->_M_function_name =
         *(int *)&(local_d38._M_impl)->_M_function_name + 1;
  }
  local_c58 = (code *)0x0;
  pcStack_c50 = (code *)0x0;
  local_c68._M_unused._M_object = (void *)0x0;
  local_c68._8_8_ = 0;
  local_c68._M_unused._M_object = operator_new(0x10);
  *(uint **)local_c68._M_unused._0_8_ = puVar10;
  *(__impl **)((long)local_c68._M_unused._0_8_ + 8) = local_d38._M_impl;
  pcStack_c50 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:328:19)>
                ::_M_invoke;
  local_c58 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:328:19)>
              ::_M_manager;
  local_d08.value = "/\\*";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3438;
  local_a20._8_8_ = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_a10,(RuleDef **)(local_a20 + 8),
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_c68);
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&(local_d38._M_impl)->_M_function_name =
         *(int *)&(local_d38._M_impl)->_M_function_name + 1;
    UNLOCK();
  }
  else {
    *(int *)&(local_d38._M_impl)->_M_function_name =
         *(int *)&(local_d38._M_impl)->_M_function_name + 1;
  }
  local_c78 = (code *)0x0;
  pcStack_c70 = (code *)0x0;
  local_c88._M_unused._M_object = (void *)0x0;
  local_c88._8_8_ = 0;
  local_c88._M_unused._M_object = operator_new(0x10);
  *(uint **)local_c88._M_unused._0_8_ = puVar10;
  *(__impl **)((long)local_c88._M_unused._0_8_ + 8) = local_d38._M_impl;
  pcStack_c70 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:331:11)>
                ::_M_invoke;
  local_c78 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:331:11)>
              ::_M_manager;
  local_d08.value = "\\*/";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3450;
  local_a08 = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            (&local_a00,&local_a08,(allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_c88);
  local_5d8._M_unused._M_object = (void *)0x0;
  local_5d8._8_8_ = 0;
  local_5c0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:336:21)>
              ::_M_invoke;
  local_5c8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:336:21)>
              ::_M_manager;
  local_d08.value = "[/\\*]";
  local_d08.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002d3468;
  local_9f8._0_8_ = (RuleDef *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::RuleDef,std::allocator<trieste::detail::RuleDef>,trieste::detail::Located<char_const*>&,std::function<void(trieste::detail::Make&)>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_9f8 + 8),(RuleDef **)local_9f8,
             (allocator<trieste::detail::RuleDef> *)&local_d30,&local_d08,
             (function<void_(trieste::detail::Make_&)> *)&local_5d8);
  r_01._M_len = 4;
  r_01._M_array = (iterator)local_a28;
  trieste::Parse::operator()(local_d10,&local_ce0,r_01);
  lVar9 = 0x40;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&p_Stack_a30 + lVar9) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&p_Stack_a30 + lVar9));
    }
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != 0);
  if (local_5c8 != (code *)0x0) {
    (*local_5c8)((_Any_data *)&local_5d8,(_Any_data *)&local_5d8,__destroy_functor);
  }
  if (local_c78 != (code *)0x0) {
    (*local_c78)((_Any_data *)&local_c88,(_Any_data *)&local_c88,__destroy_functor);
  }
  if (local_c58 != (code *)0x0) {
    (*local_c58)((_Any_data *)&local_c68,(_Any_data *)&local_c68,__destroy_functor);
  }
  if (local_5a8 != (code *)0x0) {
    (*local_5a8)((_Any_data *)&local_5b8,(_Any_data *)&local_5b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ce0._M_dataplus._M_p != &local_ce0.field_2) {
    operator_delete(local_ce0._M_dataplus._M_p,local_ce0.field_2._M_allocated_capacity + 1);
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_ce8->_M_use_count = local_ce8->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_ce8->_M_use_count = local_ce8->_M_use_count + 1;
  }
  local_c98 = (code *)0x0;
  pcStack_c90 = (code *)0x0;
  local_ca8._M_unused._M_object = (void *)0x0;
  local_ca8._8_8_ = 0;
  local_ca8._M_unused._M_object = operator_new(0x10);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_ca8._M_unused._0_8_ = local_cc0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_ca8._M_unused._0_8_ + 8) =
       local_ce8;
  pcStack_c90 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:339:12)>
                ::_M_invoke;
  local_c98 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:339:12)>
              ::_M_manager;
  ::std::function<void_(trieste::detail::Make_&)>::operator=
            (&local_d10->done_,(function<void_(trieste::detail::Make_&)> *)&local_ca8);
  if (local_c98 != (code *)0x0) {
    (*local_c98)((_Any_data *)&local_ca8,(_Any_data *)&local_ca8,__destroy_functor);
  }
  local_5f8._M_unused._M_object = (void *)0x0;
  local_5f8._8_8_ = 0;
  local_5e0 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:350:14)>
              ::_M_invoke;
  local_5e8 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:350:14)>
              ::_M_manager;
  local_a28 = (undefined1  [8])Int;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)local_a20,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)&local_5f8);
  local_618._M_unused._M_object = (void *)0x0;
  local_618._8_8_ = 0;
  local_600 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:351:14)>
              ::_M_invoke;
  local_608 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:351:14)>
              ::_M_manager;
  local_a00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Hex;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)local_9f8,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)&local_618);
  local_638._M_unused._M_object = (void *)0x0;
  local_638._8_8_ = 0;
  local_620 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:352:14)>
              ::_M_invoke;
  local_628 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:352:14)>
              ::_M_manager;
  local_9d8 = (RuleDef *)Bin;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)local_9d0,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)&local_638);
  local_658._M_unused._M_object = (void *)0x0;
  local_658._8_8_ = 0;
  local_640 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:354:9)>
              ::_M_invoke;
  local_648 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:354:9)>
              ::_M_manager;
  local_9b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Float;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)local_9a8,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)&local_658);
  local_678._M_unused._M_object = (void *)0x0;
  local_678._8_8_ = 0;
  local_660 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:356:9)>
              ::_M_invoke;
  local_668 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:356:9)>
              ::_M_manager;
  local_988 = (RuleDef *)HexFloat;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)local_980,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)&local_678);
  local_698._M_unused._M_object = (void *)0x0;
  local_698._8_8_ = 0;
  local_680 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:358:9)>
              ::_M_invoke;
  local_688 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:358:9)>
              ::_M_manager;
  local_960._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Char;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)local_958,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)&local_698);
  local_6b8._M_unused._M_object = (void *)0x0;
  local_6b8._8_8_ = 0;
  local_6a0 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:362:9)>
              ::_M_invoke;
  local_6a8 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:362:9)>
              ::_M_manager;
  local_938 = (RuleDef *)Escaped;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)local_930,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)&local_6b8);
  local_6d8._M_unused._M_object = (void *)0x0;
  local_6d8._8_8_ = 0;
  local_6c0 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:366:9)>
              ::_M_invoke;
  local_6c8 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:366:9)>
              ::_M_manager;
  local_910._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)String;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)local_908,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)&local_6d8);
  this = &local_d10->gens;
  lVar9 = 0;
  do {
    this_01 = ::std::
              map<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>_>_>
              ::operator[](this,(key_type *)(local_a28 + lVar9));
    ::std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
    ::operator=(this_01,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
                         *)((long)&(((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
                                      *)local_a20)->super__Function_base)._M_functor + lVar9));
    p_Var4 = local_ce8;
    sVar2._M_impl = local_d38._M_impl;
    lVar9 = lVar9 + 0x28;
  } while (lVar9 != 0x140);
  lVar9 = 0;
  do {
    if (*(code **)((long)&local_8f8 + lVar9) != (code *)0x0) {
      (**(code **)((long)&local_8f8 + lVar9))(local_908 + lVar9,local_908 + lVar9,3);
    }
    lVar9 = lVar9 + -0x28;
  } while (lVar9 != -0x140);
  if (local_6c8 != (code *)0x0) {
    (*local_6c8)(&local_6d8,&local_6d8,__destroy_functor);
  }
  if (local_6a8 != (code *)0x0) {
    (*local_6a8)(&local_6b8,&local_6b8,__destroy_functor);
  }
  if (local_688 != (code *)0x0) {
    (*local_688)(&local_698,&local_698,__destroy_functor);
  }
  if (local_668 != (code *)0x0) {
    (*local_668)(&local_678,&local_678,__destroy_functor);
  }
  if (local_648 != (code *)0x0) {
    (*local_648)(&local_658,&local_658,__destroy_functor);
  }
  if (local_628 != (code *)0x0) {
    (*local_628)(&local_638,&local_638,__destroy_functor);
  }
  if (local_608 != (code *)0x0) {
    (*local_608)(&local_618,&local_618,__destroy_functor);
  }
  if (local_5e8 != (code *)0x0) {
    (*local_5e8)(&local_5f8,&local_5f8,__destroy_functor);
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d50._M_impl);
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2._M_impl);
  if (local_cb0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_cb0._M_pi);
  }
  return local_d10;
}

Assistant:

Parse parser()
  {
    struct Str
    {
      size_t start = 0;
      size_t end = 0;
    };

    Parse p(depth::subdirectories, wfParser);
    auto re_dir = std::make_shared<RE2>("[_[:alpha:]][_[:alnum:]]*?");
    auto depth = std::make_shared<size_t>(0);
    auto str = std::make_shared<Str>();
    auto indent = std::make_shared<std::vector<size_t>>();
    auto start_location = std::make_shared<Location>();
    indent->push_back(restart);

    p.prefile([](auto&, auto& path) { return path.extension() == ".verona"; });

    p.predir([re_dir](auto&, auto& path) {
      return RE2::FullMatch(path.filename().string(), *re_dir);
    });

    p.postparse([](auto& pp, auto& path, auto ast) {
      if (options().no_std)
        return;

      auto stdlib = pp.executable().parent_path() / "std";
      if (path != stdlib)
        ast << pp.sub_parse(stdlib);
    });

    p.postfile([indent, depth](auto&, auto&, auto) {
      *depth = 0;
      indent->clear();
      indent->push_back(restart);
    });

    p("start",
      {
        // Blank lines terminate.
        "\r?\n(?:[[:blank:]]*\r?\n)+([[:blank:]]*)" >>
          [indent](auto& m) {
            indent->back() = m.match(1).len;
            m.term(terminators);
          },

        // A newline that starts a brace block doesn't terminate.
        "\r?\n([[:blank:]]*(\\{)[[:blank:]]*)" >>
          [indent](auto& m) {
            indent->push_back(m.match(1).len);
            m.push(Brace, 2);
          },

        // A newline sometimes terminates.
        "\r?\n([[:blank:]]*)" >>
          [indent](auto& m) {
            size_t col = m.match(1).len;

            // If following a brace, don't terminate, but reset indentation.
            if (m.previous(Brace))
            {
              indent->back() = col;
              return;
            }

            // Don't terminate and don't reset indentation if:
            // * in an equals or list
            // * in a group and indented
            if (
              m.in(Equals) || m.in(List) ||
              (m.in(Group) && (col > indent->back())))
              return;

            // Otherwise, terminate and reset indentation.
            m.term(terminators);
            indent->back() = col;
          },

        // Whitespace between tokens.
        "[[:blank:]]+" >> [](auto&) {},

        // Terminator.
        ";" >> [](auto& m) { m.term(terminators); },

        // Lambda.
        "=>" >>
          [indent](auto& m) {
            indent->back() = m.match().linecol().second + 1;
            m.term(terminators);
            m.add(Arrow);
            m.term(terminators);
          },

        // List.
        "," >> [](auto& m) { m.seq(List, {Equals}); },

        // Parens.
        "(\\()[[:blank:]]*" >>
          [indent](auto& m) {
            indent->push_back(m.match().linecol().second + m.match().len);
            m.push(Paren, 1);
          },

        "\\)" >>
          [indent](auto& m) {
            indent->pop_back();
            m.term(terminators);
            m.pop(Paren);
          },

        // Square brackets.
        "(\\[)[[:blank:]]*" >>
          [indent](auto& m) {
            indent->push_back(m.match().linecol().second + m.match().len);
            m.push(Square, 1);
          },

        "\\]" >>
          [indent](auto& m) {
            indent->pop_back();
            m.term(terminators);
            m.pop(Square);
          },

        // Curly braces.
        "(\\{)[[:blank:]]*" >>
          [indent](auto& m) {
            indent->push_back(m.match().linecol().second + m.match().len);
            m.push(Brace, 1);
          },

        "\\}" >>
          [indent](auto& m) {
            indent->pop_back();
            m.term(terminators);
            m.pop(Brace);
          },

        // Bool.
        "true\\b" >> [](auto& m) { m.add(True); },
        "false\\b" >> [](auto& m) { m.add(False); },

        // Hex float.
        "0x[_[:xdigit:]]+\\.[_[:xdigit:]]+(?:p[+-][_[:digit:]]+)?\\b" >>
          [](auto& m) { m.add(HexFloat); },

        // Float.
        "[[:digit:]][_[:digit:]]*\\.[_[:digit:]]+(?:e[+-]?[_[:digit:]]+)?\\b" >>
          [](auto& m) { m.add(Float); },

        // Bin.
        "0b[_01]+\\b" >> [](auto& m) { m.add(Bin); },

        // Oct.
        "0o[_01234567]+\\b" >> [](auto& m) { m.add(Oct); },

        // Hex.
        "0x[_[:xdigit:]]+\\b" >> [](auto& m) { m.add(Hex); },

        // Int.
        "[[:digit:]][_[:digit:]]*\\b" >> [](auto& m) { m.add(Int); },

        // Escaped string.
        "\"((?:\\\"|[^\"])*?)\"" >> [](auto& m) { m.add(Escaped, 1); },

        // Unescaped string.
        "([']+)\"([^\"]*)" >>
          [str, start_location](auto& m) {
            str->start = m.match(1).len;
            str->end = 0;
            m.add(String, 2);
            *start_location = m.match(1);
            m.mode("string");
          },

        // Character literal.
        "'((?:\\'|[^'])*)'" >> [](auto& m) { m.add(Char, 1); },

        // LLVM IR literal.
        ":\\[((?:[^\\]]|\\][^:])*)\\]:" >> [](auto& m) { m.add(LLVM, 1); },

        // Line comment.
        "//[^\r\n]*" >> [](auto&) {},

        // Nested comment.
        "/\\*" >>
          [depth, start_location](auto& m) {
            assert(*depth == 0);
            ++(*depth);
            *start_location = m.match();
            m.mode("comment");
          },

        // Keywords.
        "use\\b" >>
          [](auto& m) {
            m.term(terminators);
            m.add(Use);
          },

        "type\\b" >>
          [](auto& m) {
            m.term(terminators);
            m.add(TypeAlias);
          },

        "class\\b" >>
          [](auto& m) {
            m.term(terminators);
            m.add(Class);
          },

        "where\\b" >> [](auto& m) { m.add(Where); },
        "var\\b" >> [](auto& m) { m.add(Var); },
        "let\\b" >> [](auto& m) { m.add(Let); },
        "ref\\b" >> [](auto& m) { m.add(Ref); },
        "Self\\b" >> [](auto& m) { m.add(Self); },
        "if\\b" >> [](auto& m) { m.add(If); },
        "else\\b" >> [](auto& m) { m.add(Else); },
        "new\\b" >> [](auto& m) { m.add(New); },
        "try\\b" >> [](auto& m) { m.add(Try); },
        "iso\\b" >> [](auto& m) { m.add(Iso); },
        "mut\\b" >> [](auto& m) { m.add(Mut); },
        "imm\\b" >> [](auto& m) { m.add(Imm); },

        // Don't care.
        "_\\b" >> [](auto& m) { m.add(DontCare); },

        // Reserve a sequence of underscores.
        "_(?:_)+\\b" >>
          [](auto& m) {
            m.error(
              "a sequence of two or more underscores is a reserved identifier");
          },

        // Identifier.
        "[_[:alpha:]][_[:alnum:]]*\\b" >> [](auto& m) { m.add(Ident); },

        // Ellipsis.
        "\\.\\.\\." >> [](auto& m) { m.add(Ellipsis); },

        // Dot.
        "\\." >> [](auto& m) { m.add(Dot); },

        // Triple colon.
        ":::" >> [](auto& m) { m.add(TripleColon); },

        // Double colon.
        "::" >> [](auto& m) { m.add(DoubleColon); },

        // Colon.
        ":" >> [](auto& m) { m.add(Colon); },

        // Symbol that starts with `=`.
        "=[!#$%&*+-/<=>?@\\^`|~]+" >> [](auto& m) { m.add(Symbol); },

        // Equals.
        "=" >> [](auto& m) { m.seq(Equals); },

        // Other symbols. Reserved: "'(),.:;[]_{}
        "[!#$%&*+-/<=>?@\\^`|~]+" >> [](auto& m) { m.add(Symbol); },
      });

    p("string",
      {
        "\"'" >>
          [str](auto& m) {
            m.extend_before(String);
            str->end = 1;
            if (str->start == str->end)
              m.mode("start");
          },

        "'" >>
          [str](auto& m) {
            if (str->end > 0)
            {
              str->end++;
              if (str->start == str->end)
                m.mode("start");
            }
          },

        "." >> [str](auto&) { str->end = 0; },
      });

    p("comment",
      {
        "[^/\\*]+" >> [](auto&) {},
        "/\\*" >> [depth](auto&) { ++(*depth); },

        "\\*/" >>
          [depth](auto& m) {
            if (--(*depth) == 0)
              m.mode("start");
          },

        "[/\\*]" >> [](auto&) {},
      });

    p.done([start_location](auto& m) {
      if (m.mode() == "comment")
        m.error("Unterminated comment starting at ", *start_location);

      if (m.mode() == "string")
        m.error("Unterminated string starting at ", *start_location);

      m.term(terminators);
    });

    p.gen({
      Int >> [](auto& rnd) { return std::to_string(rnd()); },
      Hex >> [](auto& rnd) { return fmt::format("{:#x}", rnd()); },
      Bin >> [](auto& rnd) { return fmt::format("{:#b}", rnd()); },
      Float >>
        [](auto& rnd) { return fmt::format("{:g}", random_double(rnd)); },
      HexFloat >>
        [](auto& rnd) { return fmt::format("{:a}", random_double(rnd)); },
      Char >>
        [](auto& rnd) {
          return unquote(fmt::format("{:?}", random_string(rnd, 1)));
        },
      Escaped >>
        [](auto& rnd) {
          return unquote(fmt::format("{:?}", random_string(rnd, 32)));
        },
      String >>
        [](auto& rnd) { return fmt::format("{}", random_string(rnd, 32)); },
    });

    return p;
  }